

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O2

void yin_print_parsed_linkage(lys_ypr_ctx_conflict *pctx,lysp_module *modp)

{
  uint16_t *puVar1;
  lysp_include *plVar2;
  ulong uVar3;
  lysp_import *plVar4;
  ulong uVar5;
  long lVar6;
  
  lVar6 = 0x32;
  uVar5 = 0;
  while( true ) {
    plVar4 = modp->imports;
    if (plVar4 == (lysp_import *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ulong *)(plVar4[-1].rev + 6);
    }
    if (uVar3 <= uVar5) break;
    if ((plVar4->rev[lVar6 + -0x33] & 0x10U) == 0) {
      ypr_open(pctx,"import","module",*(char **)(plVar4->rev + lVar6 + -0x5c),'\x01');
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 + 1;
      yprp_extension_instances
                (pctx,LY_STMT_IMPORT,'\0',
                 *(lysp_ext_instance **)(modp->imports->rev + lVar6 + -0x3c),(int8_t *)0x0);
      ypr_substmt(pctx,LY_STMT_PREFIX,'\0',*(char **)(modp->imports->rev + lVar6 + -0x54),
                  *(void **)(modp->imports->rev + lVar6 + -0x3c));
      plVar4 = modp->imports;
      if (plVar4->rev[lVar6 + -0x32] != '\0') {
        ypr_substmt(pctx,LY_STMT_REVISION_DATE,'\0',plVar4->rev + lVar6 + -0x32,
                    *(void **)(plVar4->rev + lVar6 + -0x3c));
        plVar4 = modp->imports;
      }
      ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',*(char **)(plVar4->rev + lVar6 + -0x4c),
                  *(void **)(plVar4->rev + lVar6 + -0x3c));
      ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',*(char **)(modp->imports->rev + lVar6 + -0x44),
                  *(void **)(modp->imports->rev + lVar6 + -0x3c));
      puVar1 = &(pctx->field_0).field_0.level;
      *puVar1 = *puVar1 - 1;
      ypr_close(pctx,"import",'\x01');
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x40;
  }
  lVar6 = 0;
  uVar5 = 0;
  while( true ) {
    plVar2 = modp->includes;
    if (plVar2 == (lysp_include *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ulong *)(plVar2[-1].rev + 8);
    }
    if (uVar3 <= uVar5) break;
    if (plVar2->rev[lVar6 + 0xb] == '\0') {
      if ((((plVar2->rev[lVar6] == '\0') && (*(long *)(plVar2->rev + lVar6 + -0x18) == 0)) &&
          (*(long *)(plVar2->rev + lVar6 + -0x10) == 0)) &&
         (*(long *)(plVar2->rev + lVar6 + -8) == 0)) {
        ypr_open(pctx,"include","module",*(char **)(plVar2->rev + lVar6 + -0x20),-1);
      }
      else {
        ypr_open(pctx,"include","module",*(char **)(plVar2->rev + lVar6 + -0x20),'\x01');
        puVar1 = &(pctx->field_0).field_0.level;
        *puVar1 = *puVar1 + 1;
        yprp_extension_instances
                  (pctx,LY_STMT_INCLUDE,'\0',
                   *(lysp_ext_instance **)(modp->includes->rev + lVar6 + -8),(int8_t *)0x0);
        plVar2 = modp->includes;
        if (plVar2->rev[lVar6] != '\0') {
          ypr_substmt(pctx,LY_STMT_REVISION_DATE,'\0',plVar2->rev + lVar6,
                      *(void **)(plVar2->rev + lVar6 + -8));
          plVar2 = modp->includes;
        }
        ypr_substmt(pctx,LY_STMT_DESCRIPTION,'\0',*(char **)(plVar2->rev + lVar6 + -0x18),
                    *(void **)(plVar2->rev + lVar6 + -8));
        ypr_substmt(pctx,LY_STMT_REFERENCE,'\0',*(char **)(modp->includes->rev + lVar6 + -0x10),
                    *(void **)(modp->includes->rev + lVar6 + -8));
        puVar1 = &(pctx->field_0).field_0.level;
        *puVar1 = *puVar1 - 1;
        ypr_close(pctx,"include",'\x01');
      }
    }
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0x38;
  }
  return;
}

Assistant:

static void
yin_print_parsed_linkage(struct lys_ypr_ctx *pctx, const struct lysp_module *modp)
{
    LY_ARRAY_COUNT_TYPE u;

    LY_ARRAY_FOR(modp->imports, u) {
        if (modp->imports[u].flags & LYS_INTERNAL) {
            continue;
        }

        ypr_open(pctx, "import", "module", modp->imports[u].name, 1);
        LEVEL++;
        yprp_extension_instances(pctx, LY_STMT_IMPORT, 0, modp->imports[u].exts, NULL);
        ypr_substmt(pctx, LY_STMT_PREFIX, 0, modp->imports[u].prefix, modp->imports[u].exts);
        if (modp->imports[u].rev[0]) {
            ypr_substmt(pctx, LY_STMT_REVISION_DATE, 0, modp->imports[u].rev, modp->imports[u].exts);
        }
        ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, modp->imports[u].dsc, modp->imports[u].exts);
        ypr_substmt(pctx, LY_STMT_REFERENCE, 0, modp->imports[u].ref, modp->imports[u].exts);
        LEVEL--;
        ypr_close(pctx, "import", 1);
    }
    LY_ARRAY_FOR(modp->includes, u) {
        if (modp->includes[u].injected) {
            /* do not print the includes injected from submodules */
            continue;
        }
        if (modp->includes[u].rev[0] || modp->includes[u].dsc || modp->includes[u].ref || modp->includes[u].exts) {
            ypr_open(pctx, "include", "module", modp->includes[u].name, 1);
            LEVEL++;
            yprp_extension_instances(pctx, LY_STMT_INCLUDE, 0, modp->includes[u].exts, NULL);
            if (modp->includes[u].rev[0]) {
                ypr_substmt(pctx, LY_STMT_REVISION_DATE, 0, modp->includes[u].rev, modp->includes[u].exts);
            }
            ypr_substmt(pctx, LY_STMT_DESCRIPTION, 0, modp->includes[u].dsc, modp->includes[u].exts);
            ypr_substmt(pctx, LY_STMT_REFERENCE, 0, modp->includes[u].ref, modp->includes[u].exts);
            LEVEL--;
            ypr_close(pctx, "include", 1);
        } else {
            ypr_open(pctx, "include", "module", modp->includes[u].name, -1);
        }
    }
}